

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

int bf_rewind(bfile_t *bfile,uint n_bytes)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t __off;
  ulong uVar4;
  
  uVar1 = bfile->pos;
  uVar4 = (ulong)bfile->buffer_size;
  uVar2 = uVar1 / uVar4;
  uVar3 = uVar1 - n_bytes;
  if (uVar1 < n_bytes) {
    bfile->pos = 0;
    fwrite("warning: tried rewinding past beginning of file.\n",0x31,1,_stderr);
    uVar3 = bfile->pos;
    uVar4 = (ulong)bfile->buffer_size;
  }
  else {
    bfile->pos = uVar3;
    uVar1 = (ulong)n_bytes;
  }
  if (uVar3 / uVar4 < uVar2) {
    __off = (uVar3 / uVar4) * uVar4;
    bfile->ipos = __off;
    fseek((FILE *)bfile->file,__off,0);
    bf_read_buffer(bfile);
  }
  return (int)uVar1;
}

Assistant:

int
bf_rewind(
    bfile_t * bfile,
    unsigned int n_bytes )
{
    size_t prevbuf, newbuf, num_bytes = n_bytes;
    assert( bfile != NULL );
    prevbuf = bfile->pos / bfile->buffer_size;
    if ( num_bytes > bfile->pos ) {
        num_bytes = bfile->pos;
        bfile->pos = 0;
        fprintf( stderr, "warning: tried rewinding past beginning of file.\n" );
    } else {
        bfile->pos -= num_bytes;
    }
    newbuf = bfile->pos / bfile->buffer_size;
    if ( newbuf < prevbuf ) { /* rewinded past block boundary */
        /* refresh "preloaded" buffer with old buffer */
        bfile->ipos = newbuf * bfile->buffer_size;
        fseek( bfile->file, (long)bfile->ipos, SEEK_SET );
        bf_read_buffer( bfile );
    }
    return (int)num_bytes;
}